

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall
shaping_clipper::clip_to_window
          (shaping_clipper *this,float *windowed_frame,float *clipping_delta,float delta_boost)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  pfVar4 = (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->max_oversample;
  iVar2 = this->oversample;
  uVar5 = this->size * iVar2;
  uVar3 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar3;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    fVar7 = this->clip_level * *pfVar4;
    fVar8 = windowed_frame[uVar3] + clipping_delta[uVar3];
    if ((fVar7 < fVar8) || (fVar7 = -fVar7, fVar8 < fVar7)) {
      clipping_delta[uVar3] = (fVar7 - fVar8) * delta_boost + clipping_delta[uVar3];
    }
    pfVar4 = pfVar4 + iVar1 / iVar2;
  }
  return;
}

Assistant:

void shaping_clipper::clip_to_window(const float* windowed_frame, float* clipping_delta, float delta_boost) {
    const float* window = this->window.data();
    int total_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    for (int i = 0; i < total_samples; i++) {
        float limit = this->clip_level * *window;
        float effective_value = windowed_frame[i] + clipping_delta[i];
        if (effective_value > limit) {
            clipping_delta[i] += (limit - effective_value) * delta_boost;
        } else if (effective_value < -limit) {
            clipping_delta[i] += (-limit - effective_value) * delta_boost;
        }
        window += window_stride;
    }
}